

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_uncompressed_header(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  uint uVar2;
  byte bVar3;
  bool local_125;
  int local_124;
  bool local_115;
  RK_U32 local_114;
  RK_U32 local_110;
  RK_U32 value_31;
  RK_U32 value_30;
  RK_S32 qindex;
  RK_U32 idx;
  RK_U32 value_29;
  RK_U32 value_28;
  RK_U32 value_27;
  RK_U32 value_26;
  RK_U32 value_25;
  RK_U32 value_24;
  RK_U32 value_23;
  RK_U32 value_22;
  RK_U32 value_21;
  RK_U32 value_20;
  RK_U32 value_19;
  RK_U32 value_18;
  RK_U32 value_17;
  RK_S32 in_spatial_layer;
  RK_S32 in_temporal_layer;
  RK_S32 op_pt_idc;
  RK_U32 value_16;
  RK_U32 value_15;
  RK_U32 value_14;
  RK_U32 value_13;
  RK_U32 value_12;
  RK_U32 value_11;
  RK_U32 value_10;
  RK_U32 value_9;
  RK_U32 value_8;
  RK_U32 value_7;
  RK_U32 value_6;
  RK_U32 value_5;
  RK_U32 refresh_frame_flags;
  RK_U32 value_4;
  RK_U32 value_3;
  RK_U32 value_2;
  RK_U32 value_1;
  AV1ReferenceFrameState *ref;
  RK_U32 value;
  RK_S32 err;
  RK_S32 i;
  RK_S32 order_hint_bits;
  RK_S32 frame_is_intra;
  RK_S32 all_frames;
  RK_S32 diff_len;
  RK_S32 id_len;
  AV1RawSequenceHeader *seq;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  seq = (AV1RawSequenceHeader *)current;
  current_local = (AV1RawFrameHeader *)gb;
  gb_local = &ctx->gb;
  if (ctx->sequence_header == (AV1RawSequenceHeader *)0x0) {
    _mpp_log_l(2,"av1d_cbs","No sequence header available: unable to decode frame header.\n",
               "mpp_av1_uncompressed_header");
    return -2;
  }
  _diff_len = ctx->sequence_header;
  all_frames = (uint)_diff_len->additional_frame_id_length_minus_1 +
               (uint)_diff_len->delta_frame_id_length_minus_2 + 3;
  order_hint_bits = 0xff;
  if (_diff_len->reduced_still_picture_header == '\0') {
    ref._4_4_ = mpp_av1_read_unsigned(gb,1,"show_existing_frame",(RK_U32 *)&ref,0,1);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    seq->seq_profile = (RK_U8)ref;
    if (seq->seq_profile != '\0') {
      ref._4_4_ = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,3,"frame_to_show_map_idx",&value_3,0,7);
      if (ref._4_4_ < 0) {
        return ref._4_4_;
      }
      seq->still_picture = (RK_U8)value_3;
      _value_2 = (int *)((long)gb_local + (ulong)seq->still_picture * 0xfc + 0x1d3c4);
      if (*_value_2 == 0) {
        _mpp_log_l(2,"av1d_cbs",
                   "Missing reference frame needed for show_existing_frame (frame_to_show_map_idx = %d).\n"
                   ,"mpp_av1_uncompressed_header",(ulong)seq->still_picture);
        return -2;
      }
      if ((_diff_len->decoder_model_info_present_flag != '\0') &&
         ((_diff_len->timing_info).equal_picture_interval == '\0')) {
        ref._4_4_ = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,
                               (_diff_len->decoder_model_info).
                               frame_presentation_time_length_minus_1 + 1,"frame_presentation_time",
                               &value_4,0,
                               (int)(1L << ((_diff_len->decoder_model_info).
                                            frame_presentation_time_length_minus_1 + 1 & 0x3f)) - 1)
        ;
        if (ref._4_4_ < 0) {
          return ref._4_4_;
        }
        seq->decoder_model_info_present_flag = (undefined1)value_4;
        seq->initial_display_delay_present_flag = value_4._1_1_;
        seq->operating_points_cnt_minus_1 = value_4._2_1_;
        seq->field_0x7 = value_4._3_1_;
      }
      if (_diff_len->frame_id_numbers_present_flag != '\0') {
        RVar1 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,all_frames,"display_frame_id",
                           &refresh_frame_flags,0,(int)(1L << ((byte)all_frames & 0x3f)) - 1);
        if (RVar1 < 0) {
          return RVar1;
        }
        (seq->timing_info).num_units_in_display_tick = refresh_frame_flags;
      }
      *(char *)&(seq->timing_info).time_scale = (char)_value_2[7];
      if ((char)(seq->timing_info).time_scale == '\0') {
        seq->decoder_model_present_for_this_op[0xd] = (RK_U8)order_hint_bits;
        (seq->timing_info).num_ticks_per_picture_minus_1 = _value_2[1];
        *(int *)((long)&gb_local[0x50].emulation_prevention_bytes_ + 4) = _value_2[2];
        *(int *)((long)&gb_local[0x50].prev_two_bytes_ + 4) = _value_2[3];
        *(int *)&gb_local[0x50].emulation_prevention_bytes_ = _value_2[4];
        gb_local[0x50].used_bits = _value_2[5];
        *(int *)&gb_local[0x50].field_0x34 = _value_2[6];
        *(int *)&gb_local[0x50].field_0x1c = _value_2[10];
        *(int *)&gb_local[0x50].prev_two_bytes_ = _value_2[0xb];
      }
      else {
        seq->decoder_model_present_for_this_op[0xd] = '\0';
      }
      *(short *)(seq->seq_tier + 0x1a) = (short)_value_2[2] + -1;
      *(short *)(seq->seq_tier + 0x1c) = (short)_value_2[4] + -1;
      *(short *)(seq->decoder_model_present_for_this_op + 2) = (short)_value_2[5] + -1;
      *(short *)(seq->decoder_model_present_for_this_op + 4) = (short)_value_2[6] + -1;
      return 0;
    }
    ref._4_4_ = mpp_av1_read_unsigned((BitReadCtx_t *)current_local,2,"frame_type",&value_5,0,3);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    *(undefined1 *)&(seq->timing_info).time_scale = (undefined1)value_5;
    local_115 = true;
    if ((char)(seq->timing_info).time_scale != '\x02') {
      local_115 = (char)(seq->timing_info).time_scale == '\0';
    }
    i = (RK_S32)local_115;
    *(bool *)((long)&gb_local[0x544].update_curbyte + 3) = local_115;
    if ((char)(seq->timing_info).time_scale == '\0') {
      value_6 = 0xff;
      Av1GetCDFs((AV1Context *)gb_local,(uint)seq->still_picture);
      Av1StoreCDFs((AV1Context *)gb_local,value_6);
    }
    ref._4_4_ = mpp_av1_read_unsigned((BitReadCtx_t *)current_local,1,"show_frame",&value_7,0,1);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    *(undefined1 *)((long)&(seq->timing_info).time_scale + 1) = (undefined1)value_7;
    if (((*(char *)((long)&(seq->timing_info).time_scale + 1) != '\0') &&
        (_diff_len->decoder_model_info_present_flag != '\0')) &&
       ((_diff_len->timing_info).equal_picture_interval == '\0')) {
      ref._4_4_ = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,
                             (_diff_len->decoder_model_info).frame_presentation_time_length_minus_1
                             + 1,"frame_presentation_time",&value_8,0,
                             (int)(1L << ((_diff_len->decoder_model_info).
                                          frame_presentation_time_length_minus_1 + 1 & 0x3f)) - 1);
      if (ref._4_4_ < 0) {
        return ref._4_4_;
      }
      seq->decoder_model_info_present_flag = (undefined1)value_8;
      seq->initial_display_delay_present_flag = value_8._1_1_;
      seq->operating_points_cnt_minus_1 = value_8._2_1_;
      seq->field_0x7 = value_8._3_1_;
    }
    if (*(char *)((long)&(seq->timing_info).time_scale + 1) == '\0') {
      ref._4_4_ = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,1,"showable_frame",&value_9,0,1);
      if (ref._4_4_ < 0) {
        return ref._4_4_;
      }
      *(undefined1 *)((long)&(seq->timing_info).time_scale + 2) = (undefined1)value_9;
    }
    else {
      *(bool *)((long)&(seq->timing_info).time_scale + 2) =
           (char)(seq->timing_info).time_scale != '\0';
    }
    if (((char)(seq->timing_info).time_scale == '\x03') ||
       (((char)(seq->timing_info).time_scale == '\0' &&
        (*(char *)((long)&(seq->timing_info).time_scale + 1) != '\0')))) {
      *(undefined1 *)((long)&(seq->timing_info).time_scale + 3) = 1;
    }
    else {
      ref._4_4_ = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,1,"error_resilient_mode",&value_10,0,1);
      if (ref._4_4_ < 0) {
        return ref._4_4_;
      }
      *(undefined1 *)((long)&(seq->timing_info).time_scale + 3) = (undefined1)value_10;
    }
  }
  else {
    current->show_existing_frame = '\0';
    current->frame_type = '\0';
    current->show_frame = '\x01';
    current->showable_frame = '\0';
    i = 1;
  }
  if (((char)(seq->timing_info).time_scale == '\0') &&
     (*(char *)((long)&(seq->timing_info).time_scale + 1) != '\0')) {
    for (value = 0; (int)value < 8; value = value + 1) {
      *(undefined4 *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3c4) = 0;
      *(undefined4 *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3f0) = 0;
    }
  }
  ref._4_4_ = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)current_local,1,"disable_cdf_update",&value_11,0,1);
  if (ref._4_4_ < 0) {
    return ref._4_4_;
  }
  (seq->timing_info).equal_picture_interval = (RK_U8)value_11;
  if (_diff_len->seq_force_screen_content_tools == '\x02') {
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,1,"allow_screen_content_tools",&value_12,0,
                           1);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    (seq->timing_info).field_0x9 = (undefined1)value_12;
  }
  else {
    (seq->timing_info).field_0x9 = _diff_len->seq_force_screen_content_tools;
  }
  if ((seq->timing_info).field_0x9 == '\0') {
    (seq->timing_info).field_0xa = 0;
  }
  else if (_diff_len->seq_force_integer_mv == '\x02') {
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,1,"force_integer_mv",&value_13,0,1);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    (seq->timing_info).field_0xa = (undefined1)value_13;
  }
  else {
    (seq->timing_info).field_0xa = _diff_len->seq_force_integer_mv;
  }
  if (_diff_len->frame_id_numbers_present_flag == '\0') {
    (seq->timing_info).num_ticks_per_picture_minus_1 = 0;
  }
  else {
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,all_frames,"current_frame_id",&value_14,0,
                           (int)(1L << ((byte)all_frames & 0x3f)) - 1);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    (seq->timing_info).num_ticks_per_picture_minus_1 = value_14;
    frame_is_intra = _diff_len->delta_frame_id_length_minus_2 + 2;
    for (value = 0; (int)value < 8; value = value + 1) {
      bVar3 = (byte)frame_is_intra;
      if (1 << (bVar3 & 0x1f) < (int)(seq->timing_info).num_ticks_per_picture_minus_1) {
        if (((int)(seq->timing_info).num_ticks_per_picture_minus_1 <
             *(int *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3c8)) ||
           (*(int *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3c8) <
            (int)((seq->timing_info).num_ticks_per_picture_minus_1 - (1 << (bVar3 & 0x1f))))) {
          *(undefined4 *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3c4) = 0;
        }
      }
      else if (((int)(seq->timing_info).num_ticks_per_picture_minus_1 <
                *(int *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3c8)) &&
              (*(int *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3c8) <
               (int)(((1 << ((byte)all_frames & 0x1f)) +
                     (seq->timing_info).num_ticks_per_picture_minus_1) - (1 << (bVar3 & 0x1f))))) {
        *(undefined4 *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3c4) = 0;
      }
    }
  }
  if ((char)(seq->timing_info).time_scale == '\x03') {
    (seq->decoder_model_info).buffer_delay_length_minus_1 = '\x01';
  }
  else if (_diff_len->reduced_still_picture_header == '\0') {
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,1,"frame_size_override_flag",&value_15,0,1)
    ;
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    (seq->decoder_model_info).buffer_delay_length_minus_1 = (RK_U8)value_15;
  }
  else {
    (seq->decoder_model_info).buffer_delay_length_minus_1 = '\0';
  }
  if (_diff_len->enable_order_hint == '\0') {
    local_124 = 0;
  }
  else {
    local_124 = _diff_len->order_hint_bits_minus_1 + 1;
  }
  err = local_124;
  if (local_124 == 0) {
    (seq->decoder_model_info).field_0x1 = 0;
  }
  else {
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,local_124,"order_hint",&value_16,0,
                           (int)(1L << ((byte)local_124 & 0x3f)) - 1);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    (seq->decoder_model_info).field_0x1 = (undefined1)value_16;
  }
  *(uint *)&gb_local[0x50].prev_two_bytes_ = (uint)(byte)(seq->decoder_model_info).field_0x1;
  if ((i == 0) && (*(char *)((long)&(seq->timing_info).time_scale + 3) == '\0')) {
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,3,"primary_ref_frame",(RK_U32 *)&op_pt_idc,
                           0,7);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    seq->seq_tier[0x18] = (RK_U8)op_pt_idc;
  }
  else {
    seq->seq_tier[0x18] = '\a';
  }
  if (_diff_len->decoder_model_info_present_flag != '\0') {
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,1,"buffer_removal_time_present_flag",
                           (RK_U32 *)&in_temporal_layer,0,1);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    (seq->decoder_model_info).field_0x2 = (undefined1)in_temporal_layer;
    if ((seq->decoder_model_info).field_0x2 != '\0') {
      for (value = 0; (int)value <= (int)(uint)_diff_len->operating_points_cnt_minus_1;
          value = value + 1) {
        if (_diff_len->decoder_model_present_for_this_op[(int)value] != '\0') {
          in_spatial_layer = (RK_S32)_diff_len->operating_point_idc[(int)value];
          value_17 = in_spatial_layer >> ((byte)(int)gb_local[0x50].curr_byte_ & 0x1f) & 1;
          value_18 = in_spatial_layer >>
                     ((char)*(undefined4 *)((long)&gb_local[0x50].curr_byte_ + 4) + 8U & 0x1f) & 1;
          if ((_diff_len->operating_point_idc[(int)value] == 0) ||
             ((value_17 != 0 && (value_18 != 0)))) {
            ref._4_4_ = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)current_local,
                                   (_diff_len->decoder_model_info).
                                   buffer_removal_time_length_minus_1 + 1,"buffer_removal_time[i]",
                                   &value_19,0,
                                   (int)(1L << ((_diff_len->decoder_model_info).
                                                buffer_removal_time_length_minus_1 + 1 & 0x3f)) - 1)
            ;
            if (ref._4_4_ < 0) {
              return ref._4_4_;
            }
            *(RK_U32 *)(seq->operating_point_idc + (long)(int)value * 2 + -4) = value_19;
          }
        }
      }
    }
  }
  if (((char)(seq->timing_info).time_scale == '\x03') ||
     (((char)(seq->timing_info).time_scale == '\0' &&
      (*(char *)((long)&(seq->timing_info).time_scale + 1) != '\0')))) {
    seq->decoder_model_present_for_this_op[0xd] = (RK_U8)order_hint_bits;
  }
  else {
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,8,"refresh_frame_flags",&value_20,0,0xff);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    seq->decoder_model_present_for_this_op[0xd] = (RK_U8)value_20;
  }
  *(RK_U8 *)((long)&gb_local[0x544].update_curbyte + 4) =
       seq->decoder_model_present_for_this_op[0xd];
  if (((i == 0) || ((uint)seq->decoder_model_present_for_this_op[0xd] != order_hint_bits)) &&
     (_diff_len->enable_order_hint != '\0')) {
    value = 0;
    while( true ) {
      if (7 < (int)value) break;
      if (*(char *)((long)&(seq->timing_info).time_scale + 3) == '\0') {
        seq->decoder_model_present_for_this_op[(long)(int)value + 0xf] =
             (RK_U8)*(undefined4 *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3f0);
      }
      else {
        ref._4_4_ = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,err,"ref_order_hint[i]",&value_21,0,
                               (int)(1L << ((byte)err & 0x3f)) - 1);
        if (ref._4_4_ < 0) {
          return ref._4_4_;
        }
        seq->decoder_model_present_for_this_op[(long)(int)value + 0xf] = (RK_U8)value_21;
      }
      if ((uint)seq->decoder_model_present_for_this_op[(long)(int)value + 0xf] !=
          *(uint *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3f0)) {
        *(undefined4 *)((long)gb_local + (long)(int)value * 0xfc + 0x1d3c4) = 0;
      }
      value = value + 1;
    }
  }
  seq->decoder_model_present_for_this_op[0x1a] = '\x01';
  if (((char)(seq->timing_info).time_scale == '\0') ||
     ((char)(seq->timing_info).time_scale == '\x02')) {
    ref._4_4_ = mpp_av1_frame_size((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                   (AV1RawFrameHeader *)seq);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    ref._4_4_ = mpp_av1_render_size((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                    (AV1RawFrameHeader *)seq);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    if (((seq->timing_info).field_0x9 == '\0') ||
       (*(int *)((long)&gb_local[0x50].emulation_prevention_bytes_ + 4) !=
        *(int *)((long)&gb_local[0x50].prev_two_bytes_ + 4))) {
      seq->decoder_model_present_for_this_op[0xe] = '\0';
    }
    else {
      ref._4_4_ = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,1,"allow_intrabc",&value_22,0,1);
      if (ref._4_4_ < 0) {
        return ref._4_4_;
      }
      seq->decoder_model_present_for_this_op[0xe] = (RK_U8)value_22;
    }
    seq->decoder_model_present_for_this_op[0x1a] = '\0';
  }
  else {
    if (_diff_len->enable_order_hint == '\0') {
      seq->decoder_model_present_for_this_op[0x17] = '\0';
    }
    else {
      ref._4_4_ = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,1,"frame_refs_short_signaling",&value_23,
                             0,1);
      if (ref._4_4_ < 0) {
        return ref._4_4_;
      }
      seq->decoder_model_present_for_this_op[0x17] = (RK_U8)value_23;
      if (seq->decoder_model_present_for_this_op[0x17] != '\0') {
        ref._4_4_ = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,3,"last_frame_idx",&value_24,0,7);
        if (ref._4_4_ < 0) {
          return ref._4_4_;
        }
        seq->decoder_model_present_for_this_op[0x18] = (RK_U8)value_24;
        ref._4_4_ = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,3,"golden_frame_idx",&value_25,0,7);
        if (ref._4_4_ < 0) {
          return ref._4_4_;
        }
        seq->decoder_model_present_for_this_op[0x19] = (RK_U8)value_25;
        ref._4_4_ = mpp_av1_set_frame_refs
                              ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                               (AV1RawFrameHeader *)seq);
        if (ref._4_4_ < 0) {
          return ref._4_4_;
        }
      }
    }
    value = 0;
    while( true ) {
      if (6 < (int)value) break;
      if (seq->decoder_model_present_for_this_op[0x17] == '\0') {
        ref._4_4_ = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,3,"ref_frame_idx[i]",&value_26,0,7);
        if (ref._4_4_ < 0) {
          return ref._4_4_;
        }
        seq->decoder_model_present_for_this_op[(long)(int)value + 0x1b] = (RK_U8)value_26;
      }
      if (_diff_len->frame_id_numbers_present_flag != '\0') {
        ref._4_4_ = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,
                               _diff_len->delta_frame_id_length_minus_2 + 2,
                               "delta_frame_id_minus1[i]",&value_27,0,
                               (int)(1L << (_diff_len->delta_frame_id_length_minus_2 + 2 & 0x3f)) -
                               1);
        if (ref._4_4_ < 0) {
          return ref._4_4_;
        }
        seq->decoder_buffer_delay[(long)(int)value + 1] = value_27;
      }
      value = value + 1;
    }
    if (((seq->decoder_model_info).buffer_delay_length_minus_1 == '\0') ||
       (*(char *)((long)&(seq->timing_info).time_scale + 3) != '\0')) {
      ref._4_4_ = mpp_av1_frame_size((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                     (AV1RawFrameHeader *)seq);
      if (ref._4_4_ < 0) {
        return ref._4_4_;
      }
      ref._4_4_ = mpp_av1_render_size((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                      (AV1RawFrameHeader *)seq);
    }
    else {
      ref._4_4_ = mpp_av1_frame_size_with_refs
                            ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                             (AV1RawFrameHeader *)seq);
    }
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    if ((seq->timing_info).field_0xa == '\0') {
      ref._4_4_ = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,1,"allow_high_precision_mv",&value_28,0,1
                            );
      if (ref._4_4_ < 0) {
        return ref._4_4_;
      }
      *(undefined1 *)(seq->decoder_buffer_delay + 8) = (undefined1)value_28;
    }
    else {
      *(undefined1 *)(seq->decoder_buffer_delay + 8) = 0;
    }
    ref._4_4_ = mpp_av1_interpolation_filter
                          ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                           (AV1RawFrameHeader *)seq);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,1,"is_motion_mode_switchable",&value_29,0,1
                          );
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    *(undefined1 *)((long)seq->decoder_buffer_delay + 0x23) = (undefined1)value_29;
    if ((*(char *)((long)&(seq->timing_info).time_scale + 3) == '\0') &&
       (_diff_len->enable_ref_frame_mvs != '\0')) {
      ref._4_4_ = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,1,"use_ref_frame_mvs",&idx,0,1);
      if (ref._4_4_ < 0) {
        return ref._4_4_;
      }
      *(undefined1 *)(seq->decoder_buffer_delay + 9) = (undefined1)idx;
    }
    else {
      *(undefined1 *)(seq->decoder_buffer_delay + 9) = 0;
    }
    seq->decoder_model_present_for_this_op[0xe] = '\0';
  }
  if ((_diff_len->reduced_still_picture_header == '\0') &&
     ((seq->timing_info).equal_picture_interval == '\0')) {
    ref._4_4_ = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,1,"disable_frame_end_update_cdf",
                           (RK_U32 *)&qindex,0,1);
    if (ref._4_4_ < 0) {
      return ref._4_4_;
    }
    *(undefined1 *)((long)seq->decoder_buffer_delay + 0x25) = (undefined1)qindex;
  }
  else {
    *(undefined1 *)((long)seq->decoder_buffer_delay + 0x25) = 1;
  }
  *(undefined1 *)((long)&gb_local[0x544].update_curbyte + 2) =
       *(undefined1 *)((long)seq->decoder_buffer_delay + 0x25);
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count((BitReadCtx_t *)current_local);
    _mpp_log_l(4,"av1d_cbs","ptile_info in %d","mpp_av1_uncompressed_header");
  }
  ref._4_4_ = mpp_av1_tile_info((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                (AV1RawFrameHeader *)seq);
  ctx_local._4_4_ = ref._4_4_;
  if (-1 < ref._4_4_) {
    if ((av1d_debug & 2) != 0) {
      mpp_get_bits_count((BitReadCtx_t *)current_local);
      _mpp_log_l(4,"av1d_cbs","ptile_info out %d","mpp_av1_uncompressed_header");
    }
    ref._4_4_ = mpp_av1_quantization_params
                          ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                           (AV1RawFrameHeader *)seq);
    ctx_local._4_4_ = ref._4_4_;
    if (-1 < ref._4_4_) {
      if ((av1d_debug & 2) != 0) {
        mpp_get_bits_count((BitReadCtx_t *)current_local);
        _mpp_log_l(4,"av1d_cbs","quantization out %d","mpp_av1_uncompressed_header");
      }
      ref._4_4_ = mpp_av1_segmentation_params
                            ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                             (AV1RawFrameHeader *)seq);
      ctx_local._4_4_ = ref._4_4_;
      if (-1 < ref._4_4_) {
        if ((av1d_debug & 2) != 0) {
          mpp_get_bits_count((BitReadCtx_t *)current_local);
          _mpp_log_l(4,"av1d_cbs","segmentation out %d","mpp_av1_uncompressed_header");
        }
        ref._4_4_ = mpp_av1_delta_q_params
                              ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                               (AV1RawFrameHeader *)seq);
        ctx_local._4_4_ = ref._4_4_;
        if (-1 < ref._4_4_) {
          if ((av1d_debug & 2) != 0) {
            mpp_get_bits_count((BitReadCtx_t *)current_local);
            _mpp_log_l(4,"av1d_cbs","delta_q out %d","mpp_av1_uncompressed_header");
          }
          ref._4_4_ = mpp_av1_delta_lf_params
                                ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                 (AV1RawFrameHeader *)seq);
          ctx_local._4_4_ = ref._4_4_;
          if (-1 < ref._4_4_) {
            if ((av1d_debug & 2) != 0) {
              mpp_get_bits_count((BitReadCtx_t *)current_local);
              _mpp_log_l(4,"av1d_cbs","lf out %d","mpp_av1_uncompressed_header");
            }
            if (((*(char *)((long)&(seq->timing_info).time_scale + 3) == '\0') && (i == 0)) &&
               (seq->seq_tier[0x18] != '\a')) {
              value_30 = (RK_U32)(char)seq->decoder_model_present_for_this_op
                                       [(ulong)seq->seq_tier[0x18] + 0x1b];
              Av1GetCDFs((AV1Context *)gb_local,value_30);
            }
            else {
              gb_local[0x51].curr_byte_ = (RK_S64)&gb_local[0x51].prev_two_bytes_;
              *(RK_U8 ***)&gb_local[0x51].num_remaining_bits_in_curr_byte_ = &gb_local[0xdc].buf;
              Av1DefaultCoeffProbs
                        ((uint)*(byte *)((long)seq->encoder_buffer_delay + 0x32),
                         (void *)gb_local[0x51].curr_byte_);
            }
            if ((av1d_debug & 2) != 0) {
              _mpp_log_l(4,"av1d_cbs",
                         "show_existing_frame_index %d primary_ref_frame %d %d (%d) refresh_frame_flags %d base_q_idx %d\n"
                         ,"mpp_av1_uncompressed_header",(ulong)seq->still_picture,
                         (ulong)(uint)(int)(char)seq->decoder_model_present_for_this_op
                                                 [(ulong)seq->seq_tier[0x18] + 0x1b],
                         *(undefined4 *)
                          ((long)gb_local +
                          (long)(char)seq->decoder_model_present_for_this_op
                                      [(ulong)seq->seq_tier[0x18] + 0x1b] * 0x2f8 + 0xb0),
                         (uint)seq->seq_tier[0x18],(uint)seq->decoder_model_present_for_this_op[0xd]
                         ,(uint)*(byte *)((long)seq->encoder_buffer_delay + 0x32));
            }
            Av1StoreCDFs((AV1Context *)gb_local,(uint)seq->decoder_model_present_for_this_op[0xd]);
            *(undefined4 *)((long)&gb_local[0x50].buf + 4) = 1;
            value = 0;
            while( true ) {
              if (7 < (int)value) break;
              if (seq->low_delay_mode_flag[(long)(int)value * 8 + -0x3f] == '\0') {
                value_31 = (RK_U32)*(byte *)((long)seq->encoder_buffer_delay + 0x32);
              }
              else {
                value_31 = (uint)*(byte *)((long)seq->encoder_buffer_delay + 0x32) +
                           (int)*(short *)(seq->low_delay_mode_flag + (long)(int)value * 0x10 + 2);
              }
              value_31 = mpp_clip_uintp2(value_31,8);
              if (((value_31 != 0) || (*(char *)((long)seq->encoder_buffer_delay + 0x33) != '\0'))
                 || ((*(char *)((long)seq->encoder_buffer_delay + 0x36) != '\0' ||
                     (((*(char *)((long)seq->encoder_buffer_delay + 0x35) != '\0' ||
                       ((char)seq->encoder_buffer_delay[0xe] != '\0')) ||
                      (*(char *)((long)seq->encoder_buffer_delay + 0x37) != '\0')))))) {
                *(undefined4 *)((long)&gb_local[0x50].buf + 4) = 0;
              }
              value = value + 1;
            }
            local_125 = false;
            if (*(int *)((long)&gb_local[0x50].buf + 4) != 0) {
              local_125 = *(int *)((long)&gb_local[0x50].prev_two_bytes_ + 4) ==
                          *(int *)((long)&gb_local[0x50].emulation_prevention_bytes_ + 4);
            }
            gb_local[0x50].buf_len = (uint)local_125;
            if ((av1d_debug & 2) != 0) {
              mpp_get_bits_count((BitReadCtx_t *)current_local);
              _mpp_log_l(4,"av1d_cbs","filter in %d","mpp_av1_uncompressed_header");
            }
            ref._4_4_ = mpp_av1_loop_filter_params
                                  ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                   (AV1RawFrameHeader *)seq);
            ctx_local._4_4_ = ref._4_4_;
            if (-1 < ref._4_4_) {
              if ((av1d_debug & 2) != 0) {
                mpp_get_bits_count((BitReadCtx_t *)current_local);
                _mpp_log_l(4,"av1d_cbs","cdef in %d","mpp_av1_uncompressed_header");
              }
              ref._4_4_ = mpp_av1_cdef_params((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                              (AV1RawFrameHeader *)seq);
              ctx_local._4_4_ = ref._4_4_;
              if (-1 < ref._4_4_) {
                if ((av1d_debug & 2) != 0) {
                  mpp_get_bits_count((BitReadCtx_t *)current_local);
                  _mpp_log_l(4,"av1d_cbs","lr in %d","mpp_av1_uncompressed_header");
                }
                ref._4_4_ = mpp_av1_lr_params((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                              (AV1RawFrameHeader *)seq);
                ctx_local._4_4_ = ref._4_4_;
                if (-1 < ref._4_4_) {
                  if ((av1d_debug & 2) != 0) {
                    mpp_get_bits_count((BitReadCtx_t *)current_local);
                    _mpp_log_l(4,"av1d_cbs","read_tx in %d","mpp_av1_uncompressed_header");
                  }
                  ref._4_4_ = mpp_av1_read_tx_mode
                                        ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                         (AV1RawFrameHeader *)seq);
                  ctx_local._4_4_ = ref._4_4_;
                  if (-1 < ref._4_4_) {
                    if ((av1d_debug & 2) != 0) {
                      mpp_get_bits_count((BitReadCtx_t *)current_local);
                      _mpp_log_l(4,"av1d_cbs","reference in%d","mpp_av1_uncompressed_header");
                    }
                    ref._4_4_ = mpp_av1_frame_reference_mode
                                          ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                           (AV1RawFrameHeader *)seq);
                    ctx_local._4_4_ = ref._4_4_;
                    if (-1 < ref._4_4_) {
                      if ((av1d_debug & 2) != 0) {
                        mpp_get_bits_count((BitReadCtx_t *)current_local);
                        _mpp_log_l(4,"av1d_cbs","kip_mode in %d","mpp_av1_uncompressed_header");
                      }
                      ref._4_4_ = mpp_av1_skip_mode_params
                                            ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,
                                             (AV1RawFrameHeader *)seq);
                      ctx_local._4_4_ = ref._4_4_;
                      if (-1 < ref._4_4_) {
                        if (((i == 0) &&
                            (*(char *)((long)&(seq->timing_info).time_scale + 3) == '\0')) &&
                           (_diff_len->enable_warped_motion != '\0')) {
                          ref._4_4_ = mpp_av1_read_unsigned
                                                ((BitReadCtx_t *)current_local,1,
                                                 "allow_warped_motion",&local_110,0,1);
                          if (ref._4_4_ < 0) {
                            return ref._4_4_;
                          }
                          *(undefined1 *)(seq[1].operating_point_idc + 0x11) = (undefined1)local_110
                          ;
                        }
                        else {
                          *(undefined1 *)(seq[1].operating_point_idc + 0x11) = 0;
                        }
                        ref._4_4_ = mpp_av1_read_unsigned
                                              ((BitReadCtx_t *)current_local,1,"reduced_tx_set",
                                               &local_114,0,1);
                        ctx_local._4_4_ = ref._4_4_;
                        if (-1 < ref._4_4_) {
                          *(undefined1 *)((long)seq[1].operating_point_idc + 0x23) =
                               (undefined1)local_114;
                          if ((av1d_debug & 2) != 0) {
                            uVar2 = mpp_get_bits_count((BitReadCtx_t *)current_local);
                            _mpp_log_l(4,"av1d_cbs","motion in%d","mpp_av1_uncompressed_header",
                                       (ulong)uVar2);
                          }
                          ref._4_4_ = mpp_av1_global_motion_params
                                                ((AV1Context *)gb_local,
                                                 (BitReadCtx_t *)current_local,
                                                 (AV1RawFrameHeader *)seq);
                          ctx_local._4_4_ = ref._4_4_;
                          if (-1 < ref._4_4_) {
                            if ((av1d_debug & 2) != 0) {
                              uVar2 = mpp_get_bits_count((BitReadCtx_t *)current_local);
                              _mpp_log_l(4,"av1d_cbs","grain in %d","mpp_av1_uncompressed_header",
                                         (ulong)uVar2);
                            }
                            ref._4_4_ = mpp_av1_film_grain_params
                                                  ((AV1Context *)gb_local,
                                                   (BitReadCtx_t *)current_local,
                                                   (AV1RawFilmGrainParams *)
                                                   (seq[1].decoder_buffer_delay + 0x17),
                                                   (AV1RawFrameHeader *)seq);
                            ctx_local._4_4_ = ref._4_4_;
                            if (-1 < ref._4_4_) {
                              if ((av1d_debug & 2) != 0) {
                                uVar2 = mpp_get_bits_count((BitReadCtx_t *)current_local);
                                _mpp_log_l(4,"av1d_cbs","film_grain out %d",
                                           "mpp_av1_uncompressed_header",(ulong)uVar2);
                              }
                              if ((av1d_debug & 4) != 0) {
                                _mpp_log_l(4,"av1d_cbs",
                                           "Frame %d:  size %dx%d  upscaled %d  render %dx%d  subsample %dx%d  bitdepth %d  tiles %dx%d.\n"
                                           ,"mpp_av1_uncompressed_header",
                                           (ulong)(uint)gb_local[0x50].prev_two_bytes_,
                                           (ulong)*(uint *)((long)&gb_local[0x50].prev_two_bytes_ +
                                                           4),
                                           (int)gb_local[0x50].emulation_prevention_bytes_,
                                           *(undefined4 *)
                                            ((long)&gb_local[0x50].emulation_prevention_bytes_ + 4),
                                           gb_local[0x50].used_bits,
                                           *(undefined4 *)&gb_local[0x50].field_0x34,
                                           (_diff_len->color_config).subsampling_x + 1,
                                           (_diff_len->color_config).subsampling_y + 1,
                                           *(undefined4 *)&gb_local[0x50].field_0x1c,
                                           gb_local[0x50].prevention_type,gb_local[0x50].ret);
                              }
                              ctx_local._4_4_ = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32 mpp_av1_uncompressed_header(AV1Context *ctx, BitReadCtx_t *gb,
                                          AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq;
    RK_S32 id_len, diff_len, all_frames, frame_is_intra, order_hint_bits;
    RK_S32 i, err;

    if (!ctx->sequence_header) {
        mpp_err_f("No sequence header available: "
                  "unable to decode frame header.\n");
        return MPP_ERR_UNKNOW;
    }
    seq = ctx->sequence_header;

    id_len = seq->additional_frame_id_length_minus_1 +
             seq->delta_frame_id_length_minus_2 + 3;
    all_frames = (1 << AV1_NUM_REF_FRAMES) - 1;

    if (seq->reduced_still_picture_header) {
        infer(show_existing_frame, 0);
        infer(frame_type,     AV1_FRAME_KEY);
        infer(show_frame,     1);
        infer(showable_frame, 0);
        frame_is_intra = 1;

    } else {
        flag(show_existing_frame);

        if (current->show_existing_frame) {
            AV1ReferenceFrameState *ref;

            fb(3, frame_to_show_map_idx);
            ref = &ctx->ref_s[current->frame_to_show_map_idx];

            if (!ref->valid) {
                mpp_err_f("Missing reference frame needed for "
                          "show_existing_frame (frame_to_show_map_idx = %d).\n",
                          current->frame_to_show_map_idx);
                return MPP_ERR_UNKNOW;
            }

            if (seq->decoder_model_info_present_flag &&
                !seq->timing_info.equal_picture_interval) {
                fb(seq->decoder_model_info.frame_presentation_time_length_minus_1 + 1,
                   frame_presentation_time);
            }

            if (seq->frame_id_numbers_present_flag)
                fb(id_len, display_frame_id);

            infer(frame_type, ref->frame_type);
            if (current->frame_type == AV1_FRAME_KEY) {
                infer(refresh_frame_flags, all_frames);

                // Section 7.21
                infer(current_frame_id, ref->frame_id);
                ctx->upscaled_width  = ref->upscaled_width;
                ctx->frame_width     = ref->frame_width;
                ctx->frame_height    = ref->frame_height;
                ctx->render_width    = ref->render_width;
                ctx->render_height   = ref->render_height;
                ctx->bit_depth       = ref->bit_depth;
                ctx->order_hint      = ref->order_hint;
            } else
                infer(refresh_frame_flags, 0);

            infer(frame_width_minus_1,   ref->upscaled_width - 1);
            infer(frame_height_minus_1,  ref->frame_height - 1);
            infer(render_width_minus_1,  ref->render_width - 1);
            infer(render_height_minus_1, ref->render_height - 1);

            return 0;
        }

        fb(2, frame_type);
        frame_is_intra = (current->frame_type == AV1_FRAME_INTRA_ONLY ||
                          current->frame_type == AV1_FRAME_KEY);

        ctx->frame_is_intra = frame_is_intra;
        if (current->frame_type == AV1_FRAME_KEY) {
            RK_U32 refresh_frame_flags = (1 << NUM_REF_FRAMES) - 1;

            Av1GetCDFs(ctx, current->frame_to_show_map_idx);
            Av1StoreCDFs(ctx, refresh_frame_flags);
        }

        flag(show_frame);
        if (current->show_frame &&
            seq->decoder_model_info_present_flag &&
            !seq->timing_info.equal_picture_interval) {
            fb(seq->decoder_model_info.frame_presentation_time_length_minus_1 + 1,
               frame_presentation_time);
        }
        if (current->show_frame)
            infer(showable_frame, current->frame_type != AV1_FRAME_KEY);
        else
            flag(showable_frame);

        if (current->frame_type == AV1_FRAME_SWITCH ||
            (current->frame_type == AV1_FRAME_KEY && current->show_frame))
            infer(error_resilient_mode, 1);
        else
            flag(error_resilient_mode);
    }

    if (current->frame_type == AV1_FRAME_KEY && current->show_frame) {
        for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
            ctx->ref_s[i].valid = 0;
            ctx->ref_s[i].order_hint = 0;
        }
    }

    flag(disable_cdf_update);

    if (seq->seq_force_screen_content_tools ==
        AV1_SELECT_SCREEN_CONTENT_TOOLS) {
        flag(allow_screen_content_tools);
    } else {
        infer(allow_screen_content_tools,
              seq->seq_force_screen_content_tools);
    }
    if (current->allow_screen_content_tools) {
        if (seq->seq_force_integer_mv == AV1_SELECT_INTEGER_MV)
            flag(force_integer_mv);
        else
            infer(force_integer_mv, seq->seq_force_integer_mv);
    } else {
        infer(force_integer_mv, 0);
    }

    if (seq->frame_id_numbers_present_flag) {
        fb(id_len, current_frame_id);

        diff_len = seq->delta_frame_id_length_minus_2 + 2;
        for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
            if (current->current_frame_id > (RK_S32)(1 << diff_len)) {
                if (ctx->ref_s[i].frame_id > current->current_frame_id ||
                    ctx->ref_s[i].frame_id < (current->current_frame_id -
                                              (RK_S32)(1 << diff_len)))
                    ctx->ref_s[i].valid = 0;
            } else {
                if (ctx->ref_s[i].frame_id > current->current_frame_id &&
                    ctx->ref_s[i].frame_id < ((RK_S32)(1 << id_len) +
                                              current->current_frame_id -
                                              (RK_S32)(1 << diff_len)))
                    ctx->ref_s[i].valid = 0;
            }
        }
    } else {
        infer(current_frame_id, 0);
    }

    if (current->frame_type == AV1_FRAME_SWITCH)
        infer(frame_size_override_flag, 1);
    else if (seq->reduced_still_picture_header)
        infer(frame_size_override_flag, 0);
    else
        flag(frame_size_override_flag);

    order_hint_bits =
        seq->enable_order_hint ? seq->order_hint_bits_minus_1 + 1 : 0;
    if (order_hint_bits > 0)
        fb(order_hint_bits, order_hint);
    else
        infer(order_hint, 0);
    ctx->order_hint = current->order_hint;

    if (frame_is_intra || current->error_resilient_mode)
        infer(primary_ref_frame, AV1_PRIMARY_REF_NONE);
    else
        fb(3, primary_ref_frame);

    if (seq->decoder_model_info_present_flag) {
        flag(buffer_removal_time_present_flag);
        if (current->buffer_removal_time_present_flag) {
            for (i = 0; i <= seq->operating_points_cnt_minus_1; i++) {
                if (seq->decoder_model_present_for_this_op[i]) {
                    RK_S32 op_pt_idc = seq->operating_point_idc[i];
                    RK_S32 in_temporal_layer = (op_pt_idc >>  ctx->temporal_id    ) & 1;
                    RK_S32 in_spatial_layer  = (op_pt_idc >> (ctx->spatial_id + 8)) & 1;
                    if (seq->operating_point_idc[i] == 0 ||
                        (in_temporal_layer && in_spatial_layer)) {
                        fbs(seq->decoder_model_info.buffer_removal_time_length_minus_1 + 1,
                            buffer_removal_time[i], 1, i);
                    }
                }
            }
        }
    }

    if (current->frame_type == AV1_FRAME_SWITCH ||
        (current->frame_type == AV1_FRAME_KEY && current->show_frame))
        infer(refresh_frame_flags, all_frames);
    else
        fb(8, refresh_frame_flags);

    ctx->refresh_frame_flags = current->refresh_frame_flags;
    if (!frame_is_intra || current->refresh_frame_flags != all_frames) {
        if (seq->enable_order_hint) {
            for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
                if (current->error_resilient_mode)
                    fbs(order_hint_bits, ref_order_hint[i], 1, i);
                else
                    infer(ref_order_hint[i], ctx->ref_s[i].order_hint);
                if (current->ref_order_hint[i] != ctx->ref_s[i].order_hint)
                    ctx->ref_s[i].valid = 0;
            }
        }
    }

    current->ref_frame_valued = 1;
    if (current->frame_type == AV1_FRAME_KEY ||
        current->frame_type == AV1_FRAME_INTRA_ONLY) {
        CHECK(mpp_av1_frame_size(ctx, gb, current));
        CHECK(mpp_av1_render_size(ctx, gb, current));

        if (current->allow_screen_content_tools &&
            ctx->upscaled_width == ctx->frame_width)
            flag(allow_intrabc);
        else
            infer(allow_intrabc, 0);

        current->ref_frame_valued = 0;
    } else {
        if (!seq->enable_order_hint) {
            infer(frame_refs_short_signaling, 0);
        } else {
            flag(frame_refs_short_signaling);
            if (current->frame_refs_short_signaling) {
                fb(3, last_frame_idx);
                fb(3, golden_frame_idx);
                CHECK(mpp_av1_set_frame_refs(ctx, gb, current));
            }
        }

        for (i = 0; i < AV1_REFS_PER_FRAME; i++) {
            if (!current->frame_refs_short_signaling)
                fbs(3, ref_frame_idx[i], 1, i);
            if (seq->frame_id_numbers_present_flag) {
                fbs(seq->delta_frame_id_length_minus_2 + 2,
                    delta_frame_id_minus1[i], 1, i);
            }
        }

        if (current->frame_size_override_flag &&
            !current->error_resilient_mode) {
            CHECK(mpp_av1_frame_size_with_refs(ctx, gb, current));
        } else {
            CHECK(mpp_av1_frame_size(ctx, gb, current));
            CHECK(mpp_av1_render_size(ctx, gb, current));
        }

        if (current->force_integer_mv)
            infer(allow_high_precision_mv, 0);
        else
            flag(allow_high_precision_mv);

        CHECK(mpp_av1_interpolation_filter(ctx, gb, current));

        flag(is_motion_mode_switchable);

        if (current->error_resilient_mode ||
            !seq->enable_ref_frame_mvs)
            infer(use_ref_frame_mvs, 0);
        else
            flag(use_ref_frame_mvs);

        infer(allow_intrabc, 0);
    }

    if (!frame_is_intra) {
        // Derive reference frame sign biases.
    }

    if (seq->reduced_still_picture_header || current->disable_cdf_update)
        infer(disable_frame_end_update_cdf, 1);
    else
        flag(disable_frame_end_update_cdf);

    ctx->disable_frame_end_update_cdf = current->disable_frame_end_update_cdf;

    if (current->use_ref_frame_mvs) {
        // Perform motion field estimation process.
    }
    av1d_dbg(AV1D_DBG_HEADER, "ptile_info in %d", mpp_get_bits_count(gb));
    CHECK(mpp_av1_tile_info(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "ptile_info out %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_quantization_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "quantization out %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_segmentation_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "segmentation out %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_delta_q_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "delta_q out %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_delta_lf_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "lf out %d", mpp_get_bits_count(gb));

    // Init coeff CDFs / load previous segments.
    if (current->error_resilient_mode || frame_is_intra || current->primary_ref_frame == AV1_PRIMARY_REF_NONE) {
        // Init non-coeff CDFs.
        // Setup past independence.
        ctx->cdfs = &ctx->default_cdfs;
        ctx->cdfs_ndvc = &ctx->default_cdfs_ndvc;
        Av1DefaultCoeffProbs(current->base_q_idx, ctx->cdfs);
    } else {
        // Load CDF tables from previous frame.
        // Load params from previous frame.
        RK_U32 idx = current->ref_frame_idx[current->primary_ref_frame];

        Av1GetCDFs(ctx, idx);
    }
    av1d_dbg(AV1D_DBG_HEADER, "show_existing_frame_index %d primary_ref_frame %d %d (%d) refresh_frame_flags %d base_q_idx %d\n",
             current->frame_to_show_map_idx,
             current->ref_frame_idx[current->primary_ref_frame],
             ctx->ref[current->ref_frame_idx[current->primary_ref_frame]].slot_index,
             current->primary_ref_frame,
             current->refresh_frame_flags,
             current->base_q_idx);
    Av1StoreCDFs(ctx, current->refresh_frame_flags);

    ctx->coded_lossless = 1;
    for (i = 0; i < AV1_MAX_SEGMENTS; i++) {
        RK_S32 qindex;
        if (current->feature_enabled[i][AV1_SEG_LVL_ALT_Q]) {
            qindex = (current->base_q_idx +
                      current->feature_value[i][AV1_SEG_LVL_ALT_Q]);
        } else {
            qindex = current->base_q_idx;
        }
        qindex = mpp_clip_uintp2(qindex, 8);

        if (qindex                || current->delta_q_y_dc ||
            current->delta_q_u_ac || current->delta_q_u_dc ||
            current->delta_q_v_ac || current->delta_q_v_dc) {
            ctx->coded_lossless = 0;
        }
    }
    ctx->all_lossless = ctx->coded_lossless &&
                        ctx->frame_width == ctx->upscaled_width;
    av1d_dbg(AV1D_DBG_HEADER, "filter in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_loop_filter_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "cdef in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_cdef_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "lr in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_lr_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "read_tx in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_read_tx_mode(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "reference in%d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_frame_reference_mode(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "kip_mode in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_skip_mode_params(ctx, gb, current));

    if (frame_is_intra || current->error_resilient_mode ||
        !seq->enable_warped_motion)
        infer(allow_warped_motion, 0);
    else
        flag(allow_warped_motion);

    flag(reduced_tx_set);
    av1d_dbg(AV1D_DBG_HEADER, "motion in%d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_global_motion_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "grain in %d", mpp_get_bits_count(gb));
    CHECK(mpp_av1_film_grain_params(ctx, gb, &current->film_grain, current));
    av1d_dbg(AV1D_DBG_HEADER, "film_grain out %d", mpp_get_bits_count(gb));

    av1d_dbg(AV1D_DBG_REF, "Frame %d:  size %dx%d  "
             "upscaled %d  render %dx%d  subsample %dx%d  "
             "bitdepth %d  tiles %dx%d.\n", ctx->order_hint,
             ctx->frame_width, ctx->frame_height, ctx->upscaled_width,
             ctx->render_width, ctx->render_height,
             seq->color_config.subsampling_x + 1,
             seq->color_config.subsampling_y + 1, ctx->bit_depth,
             ctx->tile_rows, ctx->tile_cols);

    return 0;
}